

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_cstr.c
# Opt level: O1

size_t zt_hexdump(_func_int_void_ptr *_getchar,void *data,zt_hexdump_output output,void *odata)

{
  uint uVar1;
  int iVar2;
  ushort **ppuVar3;
  long lVar4;
  long lVar5;
  size_t sVar6;
  char _txt [17];
  char _hex [51];
  zt_hexdump_output local_b0;
  size_t local_a8;
  char local_88 [32];
  char local_68 [56];
  
  local_b0 = output;
  if (output == (zt_hexdump_output)0x0) {
    local_b0 = zt_hexdump_default_printer;
  }
  uVar1 = (*_getchar)(data);
  if (uVar1 == 0xffffffff) {
    sVar6 = 0;
    uVar1 = 0;
    local_a8 = 0;
  }
  else {
    local_a8 = 0;
    ppuVar3 = __ctype_b_loc();
    lVar4 = 0;
    lVar5 = 0;
    sVar6 = 0;
    do {
      if ((sVar6 & 0xf) == 0) {
        local_a8 = sVar6 & 0xffffffff;
        local_88[0] = '\0';
        local_88[1] = '\0';
        local_88[2] = '\0';
        local_88[3] = '\0';
        local_88[4] = '\0';
        local_88[5] = '\0';
        local_88[6] = '\0';
        local_88[7] = '\0';
        local_88[8] = '\0';
        local_88[9] = '\0';
        local_88[10] = '\0';
        local_88[0xb] = '\0';
        local_88[0xc] = '\0';
        local_88[0xd] = '\0';
        local_88[0xe] = '\0';
        local_88[0xf] = '\0';
        local_88[0x10] = 0;
        local_68[0] = '\0';
        local_68[1] = '\0';
        local_68[2] = '\0';
        local_68[3] = '\0';
        local_68[4] = '\0';
        local_68[5] = '\0';
        local_68[6] = '\0';
        local_68[7] = '\0';
        local_68[8] = '\0';
        local_68[9] = '\0';
        local_68[10] = '\0';
        local_68[0xb] = '\0';
        local_68[0xc] = '\0';
        local_68[0xd] = '\0';
        local_68[0xe] = '\0';
        local_68[0xf] = '\0';
        local_68[0x10] = '\0';
        local_68[0x11] = '\0';
        local_68[0x12] = '\0';
        local_68[0x13] = '\0';
        local_68[0x14] = '\0';
        local_68[0x15] = '\0';
        local_68[0x16] = '\0';
        local_68[0x17] = '\0';
        local_68[0x18] = '\0';
        local_68[0x19] = '\0';
        local_68[0x1a] = '\0';
        local_68[0x1b] = '\0';
        local_68[0x1c] = '\0';
        local_68[0x1d] = '\0';
        local_68[0x1e] = '\0';
        local_68[0x1f] = '\0';
        local_68[0x20] = '\0';
        local_68[0x21] = '\0';
        local_68[0x22] = '\0';
        local_68[0x23] = '\0';
        local_68[0x24] = '\0';
        local_68[0x25] = '\0';
        local_68[0x26] = '\0';
        local_68[0x27] = '\0';
        local_68[0x28] = '\0';
        local_68[0x29] = '\0';
        local_68[0x2a] = '\0';
        local_68[0x2b] = '\0';
        local_68[0x2c] = '\0';
        local_68[0x2d] = '\0';
        local_68[0x2e] = '\0';
        local_68[0x2f] = '\0';
        local_68[0x30] = '\0';
        local_68[0x31] = '\0';
        local_68[0x32] = '\0';
        lVar5 = 0;
        lVar4 = 0;
      }
      local_68[lVar5] = "0123456789abcdef"[uVar1 >> 4 & 0xf];
      local_68[lVar5 + 1] = "0123456789abcdef"[uVar1 & 0xf];
      local_68[lVar5 + 2] = ' ';
      if (((*ppuVar3)[(int)uVar1] >> 0xe & 1) == 0) {
        uVar1 = 0x2e;
      }
      local_88[lVar4] = (char)uVar1;
      if ((((uint)sVar6 & 0xf) == 0xf) &&
         (iVar2 = (*local_b0)(odata,local_a8,local_68,local_88), iVar2 == -1)) {
        return 0xffffffffffffffff;
      }
      lVar5 = lVar5 + 3;
      lVar4 = lVar4 + 1;
      sVar6 = sVar6 + 1;
      uVar1 = (*_getchar)(data);
    } while (uVar1 != 0xffffffff);
    uVar1 = (uint)sVar6 & 0xf;
  }
  if (((uVar1 != 0) && (uVar1 != 0xf)) &&
     (iVar2 = (*local_b0)(odata,local_a8,local_68,local_88), iVar2 == -1)) {
    return 0xffffffffffffffff;
  }
  (*local_b0)(odata,0,(char *)0x0,(char *)0x0);
  return sVar6;
}

Assistant:

size_t
zt_hexdump(int _getchar(void *), void * data, zt_hexdump_output output, void * odata) {
    size_t    bytes = 0;
    size_t    hpos = 0, cpos = 0;
    int       c = 0;
    uint32_t  addr = 0L;
    size_t    _addr = 0L;
    char      _txt[16+1];
    char      _hex[(16*3)+3];

    if (output == NULL) {
        output = zt_hexdump_default_printer;
    }

    while ((c = _getchar(data)) != EOF) {

        if (addr % 16 == 0) {
            _addr = addr;
            memset(_txt, 0, sizeof(_txt));
            memset(_hex, 0, sizeof(_hex));
            hpos = 0;
            cpos = 0;
        }

        *(_hex+hpos++) = HEX_DIGITS[((c >> 4) & 0xF)];
        *(_hex+hpos++) = HEX_DIGITS[(c  & 0xF)];
        *(_hex+hpos++) = ' ';

        *(_txt+cpos++) = isprint(c) ? c : '.';

        if (addr % 16 == 15) {
            if (output(odata, _addr, _hex, _txt) == -1) {
                return -1;
            }
        }
        addr++;
        bytes++;
    }

    if ((addr % 16 != 15) && (addr % 16 != 0)) {
        if (output(odata, _addr, _hex, _txt) == -1 ) {
            return -1;
        }
    }

    output(odata, 0, NULL, NULL);
    return bytes;
}